

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET fps_calc_inc(FpsCalc ctx)

{
  long lVar1;
  RK_S64 elapsed;
  RK_S64 now;
  RK_S64 last_count;
  RK_S64 last_time;
  RK_S64 total_count;
  RK_S64 total_time;
  FpsCalcImpl *impl;
  FpsCalc ctx_local;
  
  total_count = 0;
  last_time = 0;
  last_count = 0;
  now = 0;
  if (ctx != (FpsCalc)0x0) {
    mpp_spinlock_lock(ctx);
    lVar1 = mpp_time();
    if (*(long *)((long)ctx + 0x28) == 0) {
      *(long *)((long)ctx + 0x20) = lVar1;
      *(long *)((long)ctx + 0x30) = lVar1;
    }
    else if (999999 < lVar1 - *(long *)((long)ctx + 0x30)) {
      total_count = lVar1 - *(long *)((long)ctx + 0x20);
      last_time = *(RK_S64 *)((long)ctx + 0x28);
      last_count = lVar1 - *(long *)((long)ctx + 0x30);
      now = *(long *)((long)ctx + 0x28) - *(long *)((long)ctx + 0x38);
      *(long *)((long)ctx + 0x30) = lVar1;
      *(undefined8 *)((long)ctx + 0x38) = *(undefined8 *)((long)ctx + 0x28);
    }
    *(long *)((long)ctx + 0x28) = *(long *)((long)ctx + 0x28) + 1;
    mpp_spinlock_unlock(ctx);
    if ((*(long *)((long)ctx + 0x18) != 0) && (total_count != 0)) {
      (**(code **)((long)ctx + 0x18))(total_count,last_time,last_count,now);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET fps_calc_inc(FpsCalc ctx)
{
    FpsCalcImpl *impl = (FpsCalcImpl *)ctx;
    RK_S64 total_time = 0;
    RK_S64 total_count = 0;
    RK_S64 last_time = 0;
    RK_S64 last_count = 0;

    if (NULL == impl)
        return MPP_OK;

    mpp_spinlock_lock(&impl->lock);
    {
        RK_S64 now = mpp_time();
        if (!impl->total_count) {
            impl->total_start = now;
            impl->last_start = now;
        } else {
            RK_S64 elapsed = now - impl->last_start;

            // print on each second
            if (elapsed >= 1000000) {
                total_time = now - impl->total_start;
                total_count = impl->total_count;
                last_time = now - impl->last_start;
                last_count = impl->total_count - impl->last_count;

                impl->last_start = now;
                impl->last_count = impl->total_count;
            }
        }

        impl->total_count++;
    }
    mpp_spinlock_unlock(&impl->lock);

    if (impl->callback && total_time)
        impl->callback(total_time, total_count, last_time, last_count);

    return MPP_OK;
}